

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

void __thiscall
midi_container::trim_range_of_tracks(midi_container *this,unsigned_long start,unsigned_long end)

{
  reference pvVar1;
  size_t sVar2;
  midi_event *pmVar3;
  reference pvVar4;
  midi_event *event_1;
  unsigned_long k_1;
  unsigned_long j_1;
  midi_track *track_1;
  unsigned_long i_1;
  midi_event *event;
  midi_track *track;
  unsigned_long k;
  unsigned_long j;
  unsigned_long i;
  unsigned_long timestamp_first_note;
  unsigned_long end_local;
  unsigned_long start_local;
  midi_container *this_local;
  
  i = 0xffffffffffffffff;
  for (j = start; j <= end; j = j + 1) {
    pvVar1 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[](&this->m_tracks,j);
    k = 0;
    sVar2 = midi_track::get_count(pvVar1);
    while ((k < sVar2 &&
           ((pmVar3 = midi_track::operator[](pvVar1,k), pmVar3->m_type != note_on ||
            (pmVar3->m_data[0] == '\0'))))) {
      k = k + 1;
    }
    if ((k < sVar2) && (pmVar3 = midi_track::operator[](pvVar1,k), pmVar3->m_timestamp < i)) {
      pmVar3 = midi_track::operator[](pvVar1,k);
      i = pmVar3->m_timestamp;
    }
  }
  if ((i != 0xffffffffffffffff) && (track_1 = (midi_track *)start, i != 0)) {
    for (; track_1 <= end;
        track_1 = (midi_track *)
                  ((long)&(track_1->m_events).
                          super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                          super__Vector_impl_data._M_start + 1)) {
      pvVar1 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,(size_type)track_1);
      k_1 = 0;
      sVar2 = midi_track::get_count(pvVar1);
      for (; k_1 < sVar2; k_1 = k_1 + 1) {
        pmVar3 = midi_track::operator[](pvVar1,k_1);
        if (pmVar3->m_timestamp < i) {
          pmVar3->m_timestamp = 0;
        }
        else {
          pmVar3->m_timestamp = pmVar3->m_timestamp - i;
        }
      }
    }
    if (start == end) {
      trim_tempo_map(this,start,i);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_end,start);
      *pvVar4 = *pvVar4 - i;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_loop_end,start);
      if (*pvVar4 != 0xffffffffffffffff) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_end,start);
        *pvVar4 = *pvVar4 - i;
      }
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_loop_start,start);
      if (*pvVar4 != 0xffffffffffffffff) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_start,start);
        if (i < *pvVar4) {
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_timestamp_loop_start,start);
          *pvVar4 = *pvVar4 - i;
        }
        else {
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_timestamp_loop_start,start);
          *pvVar4 = 0;
        }
      }
    }
    else {
      trim_tempo_map(this,0,i);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_end,0);
      *pvVar4 = *pvVar4 - i;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_loop_end,0);
      if (*pvVar4 != 0xffffffffffffffff) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_end,0);
        *pvVar4 = *pvVar4 - i;
      }
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_loop_start,0);
      if (*pvVar4 != 0xffffffffffffffff) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_start,0);
        if (i < *pvVar4) {
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_timestamp_loop_start,0);
          *pvVar4 = *pvVar4 - i;
        }
        else {
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_timestamp_loop_start,0);
          *pvVar4 = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void midi_container::trim_range_of_tracks(unsigned long start, unsigned long end)
{
    unsigned long timestamp_first_note = ~0UL;

    for (unsigned long i = start; i <= end; ++i)
    {
        unsigned long j, k;

        const midi_track & track = m_tracks[ i ];

        for (j = 0, k = track.get_count(); j < k; ++j)
        {
            const midi_event & event = track[ j ];

            if ( event.m_type == midi_event::note_on && event.m_data[ 0 ] )
                break;
        }

        if ( j < k )
        {
            if ( track[ j ].m_timestamp < timestamp_first_note )
                timestamp_first_note = track[ j ].m_timestamp;
        }
    }

    if ( timestamp_first_note < ~0UL && timestamp_first_note > 0 )
    {
        for (unsigned long i = start; i <= end; ++i)
        {
            midi_track & track = m_tracks[ i ];

            for (unsigned long j = 0, k = track.get_count(); j < k; ++j)
            {
                midi_event & event = track[ j ];
                if ( event.m_timestamp >= timestamp_first_note )
                    event.m_timestamp -= timestamp_first_note;
                else
                    event.m_timestamp = 0;
            }
        }

        if ( start == end )
        {
            trim_tempo_map( start, timestamp_first_note );

            m_timestamp_end[ start ] -= timestamp_first_note;

            if ( m_timestamp_loop_end[ start ] != ~0UL )
                m_timestamp_loop_end[ start ] -= timestamp_first_note;
            if ( m_timestamp_loop_start[ start ] != ~0UL )
            {
                if ( m_timestamp_loop_start[ start ] > timestamp_first_note )
                    m_timestamp_loop_start[ start ] -= timestamp_first_note;
                else
                    m_timestamp_loop_start[ start ] = 0;
            }
        }
        else
        {
            trim_tempo_map( 0, timestamp_first_note );

            m_timestamp_end[ 0 ] -= timestamp_first_note;

            if ( m_timestamp_loop_end[ 0 ] != ~0UL )
                m_timestamp_loop_end[ 0 ] -= timestamp_first_note;
            if ( m_timestamp_loop_start[ 0 ] != ~0UL )
            {
                if ( m_timestamp_loop_start[ 0 ] > timestamp_first_note )
                    m_timestamp_loop_start[ 0 ] -= timestamp_first_note;
                else
                    m_timestamp_loop_start[ 0 ] = 0;
            }
        }
    }
}